

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O1

SRes SzBitUi32s_Alloc(CSzBitUi32s *p,size_t num,ISzAlloc *alloc)

{
  Byte *pBVar1;
  UInt32 *pUVar2;
  
  if (num == 0) {
    p->Defs = (Byte *)0x0;
    p->Vals = (UInt32 *)0x0;
  }
  else {
    pBVar1 = (Byte *)(*alloc->Alloc)(alloc,num + 7 >> 3);
    p->Defs = pBVar1;
    if (pBVar1 == (Byte *)0x0) {
      return 2;
    }
    pUVar2 = (UInt32 *)(*alloc->Alloc)(alloc,num << 2);
    p->Vals = pUVar2;
    if (pUVar2 == (UInt32 *)0x0) {
      return 2;
    }
  }
  return 0;
}

Assistant:

static SRes SzBitUi32s_Alloc(CSzBitUi32s *p, size_t num, ISzAlloc *alloc)
{
  if (num == 0)
  {
    p->Defs = NULL;
    p->Vals = NULL;
  }
  else
  {
    MY_ALLOC(Byte, p->Defs, (num + 7) >> 3, alloc);
    MY_ALLOC(UInt32, p->Vals, num, alloc);
  }
  return SZ_OK;
}